

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

int __thiscall mpt::parser::open(parser *this,char *__file,int __oflag,...)

{
  FILE *__stream;
  char *local_40;
  FILE *local_30;
  FILE *f;
  FILE *old;
  char *fn_local;
  parser *this_local;
  
  if (((this->_d).src.arg == (void *)0x0) && (__file == (char *)0x0)) {
    this_local._7_1_ = 1;
  }
  else {
    local_30 = (FILE *)0x0;
    if ((__file == (char *)0x0) || (local_30 = fopen(__file,"r"), local_30 != (FILE *)0x0)) {
      __stream = (FILE *)(this->_d).src.arg;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      (this->_d).src.getc = mpt_getchar_stdio;
      (this->_d).src.arg = local_30;
      (this->_d).src.line = 0;
      if (this->_fn != (char *)0x0) {
        free(this->_fn);
      }
      if (__file == (char *)0x0) {
        local_40 = (char *)0x0;
      }
      else {
        local_40 = strdup(__file);
      }
      this->_fn = local_40;
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
      this = (parser *)0x0;
    }
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool parser::open(const char *fn)
{
	if (!_d.src.arg) {
		if (!fn) {
			return true;
		}
	}
	FILE *old, *f = 0;
	if (fn && !(f = fopen(fn, "r"))) {
		return false;
	}
	old = static_cast<FILE *>(_d.src.arg);
	if (old) fclose(old);
	_d.src.getc = (int (*)(void *)) mpt_getchar_stdio;
	_d.src.arg  = f;
	_d.src.line = 0;
	if (_fn) free(_fn);
	_fn = fn ? strdup(fn) : 0;
	return true;
}